

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O0

int bip39_mnemonic_to_seed
              (char *mnemonic,char *passphrase,uchar *bytes_out,size_t len,size_t *written)

{
  size_t sVar1;
  size_t size;
  uchar *salt_00;
  size_t local_78;
  int ret;
  uchar *salt;
  size_t salt_len;
  size_t passphrase_len;
  size_t prefix_len;
  char *prefix;
  uint32_t bip9_cost;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  char *passphrase_local;
  char *mnemonic_local;
  
  sVar1 = strlen("mnemonic");
  if (passphrase == (char *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = strlen(passphrase);
  }
  size = sVar1 + local_78;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((mnemonic == (char *)0x0) || (bytes_out == (uchar *)0x0)) || (len != 0x40)) {
    mnemonic_local._4_4_ = -2;
  }
  else {
    salt_00 = (uchar *)wally_malloc(size);
    if (salt_00 == (uchar *)0x0) {
      mnemonic_local._4_4_ = -3;
    }
    else {
      memcpy(salt_00,"mnemonic",sVar1);
      if (local_78 != 0) {
        memcpy(salt_00 + sVar1,passphrase,local_78);
      }
      sVar1 = strlen(mnemonic);
      mnemonic_local._4_4_ =
           wally_pbkdf2_hmac_sha512((uchar *)mnemonic,sVar1,salt_00,size,0,0x800,bytes_out,0x40);
      if ((mnemonic_local._4_4_ == 0) && (written != (size_t *)0x0)) {
        *written = 0x40;
      }
      clear_and_free(salt_00,size);
    }
  }
  return mnemonic_local._4_4_;
}

Assistant:

int  bip39_mnemonic_to_seed(const char *mnemonic, const char *passphrase,
                            unsigned char *bytes_out, size_t len,
                            size_t *written)
{
    const uint32_t bip9_cost = 2048u;
    const char *prefix = "mnemonic";
    const size_t prefix_len = strlen(prefix);
    const size_t passphrase_len = passphrase ? strlen(passphrase) : 0;
    const size_t salt_len = prefix_len + passphrase_len;
    unsigned char *salt;
    int ret;

    if (written)
        *written = 0;

    if (!mnemonic || !bytes_out || len != BIP39_SEED_LEN_512)
        return WALLY_EINVAL;

    salt = wally_malloc(salt_len);
    if (!salt)
        return WALLY_ENOMEM;

    memcpy(salt, prefix, prefix_len);
    if (passphrase_len)
        memcpy(salt + prefix_len, passphrase, passphrase_len);

    ret = wally_pbkdf2_hmac_sha512((unsigned char *)mnemonic, strlen(mnemonic),
                                   salt, salt_len, 0,
                                   bip9_cost, bytes_out, len);

    if (!ret && written)
        *written = BIP39_SEED_LEN_512; /* Succeeded */

    clear_and_free(salt, salt_len);

    return ret;
}